

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

tm * anon_unknown.dwarf_31369b::timeToTm(qint64 localDay,int secs)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  tm *in_RDI;
  long in_FS_OFFSET;
  YearMonthDay YVar3;
  tm *local;
  YearMonthDay ymd;
  int local_20;
  int local_18;
  int iStack_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  YVar3 = QGregorianCalendar::partsFromJulian((qint64)local);
  local_20 = YVar3.day;
  *(undefined8 *)&in_RDI->tm_isdst = 0;
  in_RDI->tm_gmtoff = 0;
  in_RDI->tm_mon = 0;
  in_RDI->tm_year = 0;
  in_RDI->tm_wday = 0;
  in_RDI->tm_yday = 0;
  in_RDI->tm_sec = 0;
  in_RDI->tm_min = 0;
  in_RDI->tm_hour = 0;
  in_RDI->tm_mday = 0;
  in_RDI->tm_zone = (char *)0x0;
  local_18 = YVar3.year;
  iVar2 = tmYearFromQYear(local_18);
  in_RDI->tm_year = iVar2;
  iStack_14 = YVar3.month;
  in_RDI->tm_mon = iStack_14 + -1;
  in_RDI->tm_mday = local_20;
  in_RDI->tm_hour = in_EDX / 0xe10;
  in_RDI->tm_min = (in_EDX % 0xe10) / 0x3c;
  in_RDI->tm_sec = in_EDX % 0x3c;
  in_RDI->tm_isdst = -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

struct tm timeToTm(qint64 localDay, int secs)
{
    Q_ASSERT(0 <= secs && secs < SECS_PER_DAY);
    const auto ymd = QGregorianCalendar::partsFromJulian(JULIAN_DAY_FOR_EPOCH + localDay);
    struct tm local = {};
    local.tm_year = tmYearFromQYear(ymd.year);
    local.tm_mon = ymd.month - 1;
    local.tm_mday = ymd.day;
    local.tm_hour = secs / 3600;
    local.tm_min = (secs % 3600) / 60;
    local.tm_sec = (secs % 60);
    local.tm_isdst = -1;
    return local;
}